

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O0

int aead_aegis_128l_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  size_t in_stack_000000b8;
  uint8_t *in_stack_000000c0;
  size_t in_stack_000000c8;
  uint8_t *in_stack_000000d0;
  uint8_t *in_stack_000000d8;
  uint8_t *in_stack_000000e0;
  aead_aegis_128l_ctx *aegis_ctx;
  size_t in_len_local;
  uint8_t *in_local;
  size_t nonce_len_local;
  uint8_t *nonce_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  iVar1 = aegis_128l_open_gather
                    (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,
                     in_stack_000000c0,in_stack_000000b8,(uint8_t *)in_tag_len,(size_t)ad,
                     (uint8_t *)ad_len,(ulong)ctx->tag_len,(size_t)&ctx->state);
  return iVar1;
}

Assistant:

static int aead_aegis_128l_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                       const uint8_t *nonce, size_t nonce_len,
                                       const uint8_t *in, size_t in_len,
                                       const uint8_t *in_tag, size_t in_tag_len,
                                       const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                                in_len, in_tag, in_tag_len, ad, ad_len,
                                ctx->tag_len);
}